

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

QString * __thiscall
QDateTimeEdit::displayFormat(QString *__return_storage_ptr__,QDateTimeEdit *this)

{
  long lVar1;
  Data *pDVar2;
  LayoutDirection LVar3;
  long lVar4;
  
  lVar1 = *(long *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  LVar3 = QWidget::layoutDirection((QWidget *)this);
  lVar4 = 0x438;
  if (LVar3 == RightToLeft) {
    lVar4 = 0x4c0;
  }
  pDVar2 = *(Data **)(lVar1 + lVar4);
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = *(char16_t **)(lVar1 + 8 + lVar4);
  (__return_storage_ptr__->d).size = *(qsizetype *)(lVar1 + 0x10 + lVar4);
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QDateTimeEdit::displayFormat() const
{
    Q_D(const QDateTimeEdit);
    return isRightToLeft() ? d->unreversedFormat : d->displayFormat;
}